

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Atom::getGrad(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Atom *this)

{
  undefined4 *puVar1;
  double dVar2;
  long lVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  pointer pdVar7;
  long lVar8;
  
  pdVar7 = (pointer)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar7;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar7 + 3;
  *pdVar7 = 0.0;
  pdVar7[1] = 0.0;
  pdVar7[2] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar7 + 3;
  lVar8 = (long)(this->super_StuntDouble).localIndex_;
  lVar3 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                           force.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (this->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar3 + lVar8 * 0x18);
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  dVar2 = *(double *)(lVar3 + 0x10 + lVar8 * 0x18);
  *(undefined4 *)pdVar7 = *puVar1;
  *(uint *)((long)pdVar7 + 4) = uVar4 ^ 0x80000000;
  *(undefined4 *)(pdVar7 + 1) = uVar5;
  *(uint *)((long)pdVar7 + 0xc) = uVar6 ^ 0x80000000;
  pdVar7[2] = -dVar2;
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> Atom::getGrad() {
    std::vector<RealType> grad(3, 0.0);

    Vector3d force = getFrc();

    grad[0] = -force[0];
    grad[1] = -force[1];
    grad[2] = -force[2];

    return grad;
  }